

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxedit.c
# Opt level: O2

WebPMuxError WebPMuxAssemble(WebPMux *mux,WebPData *assembled_data)

{
  WebPMuxImage *pWVar1;
  ushort *puVar2;
  bool bVar3;
  byte bVar4;
  WebPMuxError WVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  uint8_t *data;
  uint8_t *puVar12;
  WebPMuxImage *pWVar13;
  uint uVar14;
  WebPMux *pWVar15;
  uint uVar16;
  uint uVar17;
  WebPMuxError WVar18;
  byte bVar19;
  size_t size;
  long lVar20;
  int num_frames;
  undefined1 local_60;
  undefined1 local_5f;
  undefined1 local_5e;
  undefined1 local_5d;
  undefined1 local_5c;
  undefined1 local_5b;
  size_t local_58;
  size_t local_50;
  int num_anim_chunks;
  WebPData local_40;
  
  WVar5 = WEBP_MUX_INVALID_ARGUMENT;
  if (assembled_data != (WebPData *)0x0) {
    assembled_data->bytes = (uint8_t *)0x0;
    assembled_data->size = 0;
    if (mux != (WebPMux *)0x0) {
      WVar5 = WebPMuxNumChunks(mux,WEBP_CHUNK_ANMF,&num_frames);
      if (WVar5 == WEBP_MUX_OK) {
        if (num_frames == 1) {
          local_40.bytes = (uint8_t *)0x0;
          WVar5 = MuxImageGetNth(&mux->images_,1,(WebPMuxImage **)&local_40);
          if (WVar5 != WEBP_MUX_OK) {
            return WVar5;
          }
          if ((*(WebPChunk **)local_40.bytes != (WebPChunk *)0x0) &&
             (((mux->canvas_width_ == 0 && (mux->canvas_height_ == 0)) ||
              ((*(int *)(local_40.bytes + 0x20) == mux->canvas_width_ &&
               (*(int *)(local_40.bytes + 0x24) == mux->canvas_height_)))))) {
            ChunkDelete(*(WebPChunk **)local_40.bytes);
            local_40.bytes[0] = '\0';
            local_40.bytes[1] = '\0';
            local_40.bytes[2] = '\0';
            local_40.bytes[3] = '\0';
            local_40.bytes[4] = '\0';
            local_40.bytes[5] = '\0';
            local_40.bytes[6] = '\0';
            local_40.bytes[7] = '\0';
            num_frames = 0;
          }
        }
        WVar5 = WebPMuxNumChunks(mux,WEBP_CHUNK_ANIM,&num_anim_chunks);
        if ((WVar5 == WEBP_MUX_OK) &&
           (((num_anim_chunks < 1 || (num_frames != 0)) ||
            (WVar5 = MuxDeleteAllNamedData(mux,0x4d494e41), WVar5 == WEBP_MUX_OK)))) {
          local_40.size = 10;
          pWVar1 = mux->images_;
          WVar18 = WEBP_MUX_INVALID_ARGUMENT;
          WVar5 = WVar18;
          if (((pWVar1 != (WebPMuxImage *)0x0) && (pWVar1->img_ != (WebPChunk *)0x0)) &&
             ((pWVar1->img_->data_).bytes != (uint8_t *)0x0)) {
            local_50 = CONCAT44(local_50._4_4_,0x58385056);
            local_40.bytes = (uint8_t *)&num_frames;
            WVar5 = MuxDeleteAllNamedData(mux,0x58385056);
            if ((uint)WVar5 < 2) {
              bVar19 = 0;
              if (mux->iccp_ != (WebPChunk *)0x0) {
                bVar19 = ((mux->iccp_->data_).bytes != (uint8_t *)0x0) << 5;
              }
              if ((mux->exif_ != (WebPChunk *)0x0) && ((mux->exif_->data_).bytes != (uint8_t *)0x0))
              {
                bVar19 = bVar19 | 8;
              }
              if ((mux->xmp_ != (WebPChunk *)0x0) && ((mux->xmp_->data_).bytes != (uint8_t *)0x0)) {
                bVar19 = bVar19 | 4;
              }
              if ((pWVar1->header_ != (WebPChunk *)0x0) && (pWVar1->header_->tag_ == 0x464d4e41)) {
                bVar19 = bVar19 | 2;
              }
              iVar6 = MuxImageCount(pWVar1,WEBP_CHUNK_ALPHA);
              bVar4 = bVar19;
              if (0 < iVar6) {
                bVar4 = bVar19 | 0x10;
              }
              pWVar13 = mux->images_;
              if (pWVar13->next_ == (WebPMuxImage *)0x0) {
                uVar7 = pWVar13->width_;
                uVar17 = pWVar13->height_;
              }
              else {
                uVar17 = 0;
                uVar7 = 0;
                for (; pWVar13 != (WebPMuxImage *)0x0; pWVar13 = pWVar13->next_) {
                  if ((pWVar13->header_->data_).size != 0x10) {
                    return WEBP_MUX_INVALID_ARGUMENT;
                  }
                  puVar2 = (ushort *)(pWVar13->header_->data_).bytes;
                  uVar16 = (uint)(byte)puVar2[1] * 0x20000 + (uint)*puVar2 * 2 + pWVar13->width_;
                  uVar14 = (uint)*(byte *)((long)puVar2 + 5) * 0x20000 +
                           (uint)*(ushort *)((long)puVar2 + 3) * 2 + pWVar13->height_;
                  if ((int)uVar17 < (int)uVar14) {
                    uVar17 = uVar14;
                  }
                  if ((int)uVar7 < (int)uVar16) {
                    uVar7 = uVar16;
                  }
                }
              }
              WVar5 = WVar18;
              if (((((0 < (int)uVar7) && (0 < (int)uVar17)) && (uVar7 < 0x1000001)) &&
                  (uVar17 < 0x1000001)) &&
                 (((uVar14 = mux->canvas_width_, uVar14 == 0 && (mux->canvas_height_ == 0)) ||
                  (((int)uVar7 <= (int)uVar14 &&
                   (bVar3 = (int)uVar17 <= mux->canvas_height_, uVar17 = mux->canvas_height_,
                   uVar7 = uVar14, bVar3)))))) {
                local_58 = CONCAT44(local_58._4_4_,uVar17);
                if ((bVar4 != 0) || (mux->unknown_ != (WebPChunk *)0x0)) {
                  iVar6 = MuxHasAlpha(pWVar1);
                  bVar19 = bVar19 | 0x10;
                  if (iVar6 == 0) {
                    bVar19 = bVar4;
                  }
                  num_frames = (int)bVar19;
                  iVar6 = uVar7 - 1;
                  local_60 = (undefined1)iVar6;
                  local_5f = (undefined1)((uint)iVar6 >> 8);
                  local_5e = (undefined1)((uint)iVar6 >> 0x10);
                  iVar6 = (int)local_58 + -1;
                  local_5d = (undefined1)iVar6;
                  local_5c = (undefined1)((uint)iVar6 >> 8);
                  local_5b = (undefined1)((uint)iVar6 >> 0x10);
                  WVar5 = MuxSet(mux,(uint32_t)local_50,&local_40,1);
                  if (WVar5 != WEBP_MUX_OK) {
                    return WVar5;
                  }
                }
                local_50 = ChunkListDiskSize(mux->vp8x_);
                local_58 = ChunkListDiskSize(mux->iccp_);
                sVar8 = ChunkListDiskSize(mux->anim_);
                lVar20 = 0;
                pWVar15 = mux;
                while (pWVar1 = pWVar15->images_, pWVar1 != (WebPMuxImage *)0x0) {
                  sVar9 = MuxImageDiskSize(pWVar1);
                  lVar20 = lVar20 + sVar9;
                  pWVar15 = (WebPMux *)&pWVar1->next_;
                }
                sVar9 = ChunkListDiskSize(mux->exif_);
                sVar10 = ChunkListDiskSize(mux->xmp_);
                sVar11 = ChunkListDiskSize(mux->unknown_);
                sVar8 = sVar11 + sVar8 + lVar20 + local_50 + local_58 + sVar9 + sVar10 + 0xc;
                data = (uint8_t *)WebPSafeMalloc(1,sVar8);
                if (data == (uint8_t *)0x0) {
                  WVar5 = WEBP_MUX_MEMORY_ERROR;
                }
                else {
                  puVar12 = MuxEmitRiffHeader(data,sVar8);
                  puVar12 = ChunkListEmit(mux->vp8x_,puVar12);
                  puVar12 = ChunkListEmit(mux->iccp_,puVar12);
                  puVar12 = ChunkListEmit(mux->anim_,puVar12);
                  pWVar15 = mux;
                  while (pWVar1 = pWVar15->images_, pWVar1 != (WebPMuxImage *)0x0) {
                    puVar12 = MuxImageEmit(pWVar1,puVar12);
                    pWVar15 = (WebPMux *)&pWVar1->next_;
                  }
                  puVar12 = ChunkListEmit(mux->exif_,puVar12);
                  puVar12 = ChunkListEmit(mux->xmp_,puVar12);
                  ChunkListEmit(mux->unknown_,puVar12);
                  WVar5 = MuxValidate(mux);
                  if (WVar5 != WEBP_MUX_OK) {
                    WebPSafeFree(data);
                    sVar8 = 0;
                    data = (uint8_t *)0x0;
                  }
                  assembled_data->bytes = data;
                  assembled_data->size = sVar8;
                }
              }
            }
          }
        }
      }
    }
  }
  return WVar5;
}

Assistant:

WebPMuxError WebPMuxAssemble(WebPMux* mux, WebPData* assembled_data) {
  size_t size = 0;
  uint8_t* data = NULL;
  uint8_t* dst = NULL;
  WebPMuxError err;

  if (assembled_data == NULL) {
    return WEBP_MUX_INVALID_ARGUMENT;
  }
  // Clean up returned data, in case something goes wrong.
  memset(assembled_data, 0, sizeof(*assembled_data));

  if (mux == NULL) {
    return WEBP_MUX_INVALID_ARGUMENT;
  }

  // Finalize mux.
  err = MuxCleanup(mux);
  if (err != WEBP_MUX_OK) return err;
  err = CreateVP8XChunk(mux);
  if (err != WEBP_MUX_OK) return err;

  // Allocate data.
  size = ChunkListDiskSize(mux->vp8x_) + ChunkListDiskSize(mux->iccp_)
       + ChunkListDiskSize(mux->anim_) + ImageListDiskSize(mux->images_)
       + ChunkListDiskSize(mux->exif_) + ChunkListDiskSize(mux->xmp_)
       + ChunkListDiskSize(mux->unknown_) + RIFF_HEADER_SIZE;

  data = (uint8_t*)WebPSafeMalloc(1ULL, size);
  if (data == NULL) return WEBP_MUX_MEMORY_ERROR;

  // Emit header & chunks.
  dst = MuxEmitRiffHeader(data, size);
  dst = ChunkListEmit(mux->vp8x_, dst);
  dst = ChunkListEmit(mux->iccp_, dst);
  dst = ChunkListEmit(mux->anim_, dst);
  dst = ImageListEmit(mux->images_, dst);
  dst = ChunkListEmit(mux->exif_, dst);
  dst = ChunkListEmit(mux->xmp_, dst);
  dst = ChunkListEmit(mux->unknown_, dst);
  assert(dst == data + size);

  // Validate mux.
  err = MuxValidate(mux);
  if (err != WEBP_MUX_OK) {
    WebPSafeFree(data);
    data = NULL;
    size = 0;
  }

  // Finalize data.
  assembled_data->bytes = data;
  assembled_data->size = size;

  return err;
}